

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_transport.c
# Opt level: O3

int tr_tcp_send(void *tr_tcp_sock,void *pdu,size_t len,time_t timeout)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  int *piVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  timeval t;
  time_t local_38 [2];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (timeout == 0) {
    iVar3 = *tr_tcp_sock;
    iVar4 = 0x40;
  }
  else {
    local_38[1] = 0;
    local_38[0] = timeout;
    iVar3 = setsockopt(*tr_tcp_sock,1,0x15,local_38,0x10);
    if (iVar3 == -1) {
      uVar1 = *(undefined8 *)((long)tr_tcp_sock + 8);
      uVar2 = *(undefined8 *)((long)tr_tcp_sock + 0x10);
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      lrtr_dbg("TCP Transport(%s:%s): setting SO_SNDTIMEO failed, %s",uVar1,uVar2,pcVar7);
      iVar3 = -1;
      goto LAB_001099bc;
    }
    iVar3 = *tr_tcp_sock;
    iVar4 = 0;
  }
  sVar5 = send(iVar3,pdu,len,iVar4);
  iVar4 = (int)sVar5;
  iVar3 = -1;
  if ((iVar4 != 0) && (iVar3 = iVar4, iVar4 == -1)) {
    piVar6 = __errno_location();
    iVar3 = *piVar6;
    if (iVar3 == 0xb) {
      iVar3 = -2;
    }
    else if (iVar3 == 4) {
      iVar3 = -3;
    }
    else {
      uVar1 = *(undefined8 *)((long)tr_tcp_sock + 8);
      uVar2 = *(undefined8 *)((long)tr_tcp_sock + 0x10);
      pcVar7 = strerror(iVar3);
      lrtr_dbg("TCP Transport(%s:%s): send(..) error: %s",uVar1,uVar2,pcVar7);
      iVar3 = -1;
    }
  }
LAB_001099bc:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

int tr_tcp_send(const void *tr_tcp_sock, const void *pdu, const size_t len, const time_t timeout)
{
	const struct tr_tcp_socket *tcp_socket = tr_tcp_sock;
	int rtval;

	if (timeout == 0) {
		rtval = send(tcp_socket->socket, pdu, len, MSG_DONTWAIT);
	} else {
		struct timeval t = {timeout, 0};

		if (setsockopt(tcp_socket->socket, SOL_SOCKET, SO_SNDTIMEO, &t, sizeof(t)) == -1) {
			TCP_DBG("setting SO_SNDTIMEO failed, %s", tcp_socket, strerror(errno));
			return TR_ERROR;
		}
		rtval = send(tcp_socket->socket, pdu, len, 0);
	}

	if (rtval == -1) {
		if (errno == EAGAIN || errno == EWOULDBLOCK)
			return TR_WOULDBLOCK;
		if (errno == EINTR)
			return TR_INTR;
		TCP_DBG("send(..) error: %s", tcp_socket, strerror(errno));
		return TR_ERROR;
	}
	if (rtval == 0)
		return TR_ERROR;
	return rtval;
}